

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode SUNAdaptController_Reset_Soderlind(SUNAdaptController C)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNAdaptController C_local;
  
  *(undefined8 *)((long)C->content + 0x30) = 0x3ff0000000000000;
  *(undefined8 *)((long)C->content + 0x38) = 0x3ff0000000000000;
  *(undefined8 *)((long)C->content + 0x40) = 0x3ff0000000000000;
  *(undefined8 *)((long)C->content + 0x48) = 0x3ff0000000000000;
  *(undefined4 *)((long)C->content + 0x50) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Reset_Soderlind(SUNAdaptController C)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_EP(C)         = SUN_RCONST(1.0);
  SODERLIND_EPP(C)        = SUN_RCONST(1.0);
  SODERLIND_HP(C)         = SUN_RCONST(1.0);
  SODERLIND_HPP(C)        = SUN_RCONST(1.0);
  SODERLIND_FIRSTSTEPS(C) = 0;
  return SUN_SUCCESS;
}